

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_cv_still_test.cpp
# Opt level: O3

float getParamVal(string *id,int argc,char **argv,float defvalue)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  
  if (0 < argc) {
    uVar2 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)id);
      if (iVar1 == 0) {
        dVar3 = atof(argv[uVar2 + 1]);
        return (float)dVar3;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  return defvalue;
}

Assistant:

float getParamVal ( string id,int argc,char **argv,float defvalue ) {
    for ( int i=0; i<argc; i++ )
        if ( id== argv[i] )
            return atof ( argv[i+1] );
    return defvalue;
}